

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O3

int * __thiscall Map::Map<long,_int>::operator[](Map<long,_int> *this,long *key)

{
  Pair<long,_int> *pPVar1;
  Iterator IVar2;
  Pair<long,_int> local_30;
  Pair<long,_int> local_20;
  
  local_30._12_4_ = SUB84((ulong)local_30.key >> 0x20,0);
  local_30.value = 0;
  local_30.key = *key;
  IVar2 = BPlusTree<Map::Pair<long,_int>_>::search(&this->tree,&local_30);
  if (IVar2.node_ptr == (BPlusTree<Map::Pair<long,_int>_> *)0x0) {
    local_30.value = 0;
    local_30.key = *key;
    BPlusTree<Map::Pair<long,_int>_>::insert(&this->tree,&local_30);
  }
  local_20.key = *key;
  local_20.value = 0;
  local_30 = (Pair<long,_int>)BPlusTree<Map::Pair<long,_int>_>::search(&this->tree,&local_20);
  pPVar1 = BPlusTree<Map::Pair<long,_int>_>::Iterator::operator->((Iterator *)&local_30);
  return &pPVar1->value;
}

Assistant:

T& Map<Key, T>::operator[](const Key& key) {
    if (tree.search(Pair<Key, T>(key, T())) == nullptr)
        tree.insert(Pair<Key, T>(key, T()));
    return tree.search(Pair<Key, T>(key, T()))->value;
}